

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O3

OPJ_BOOL opj_t1_allocate_buffers(opj_t1_t *t1,OPJ_UINT32 w,OPJ_UINT32 h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  OPJ_BOOL OVar4;
  OPJ_INT32 *ptr;
  opj_flag_t *poVar5;
  ulong uVar6;
  opj_flag_t oVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  size_t size;
  uint uVar12;
  int iVar15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar20;
  undefined1 auVar19 [16];
  
  if (0x400 < w) {
    __assert_fail("w <= 1024",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/t1.c"
                  ,0x5a8,"OPJ_BOOL opj_t1_allocate_buffers(opj_t1_t *, OPJ_UINT32, OPJ_UINT32)");
  }
  if (0x400 < h) {
    __assert_fail("h <= 1024",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/t1.c"
                  ,0x5a9,"OPJ_BOOL opj_t1_allocate_buffers(opj_t1_t *, OPJ_UINT32, OPJ_UINT32)");
  }
  uVar11 = h * w;
  if (0x1000 < uVar11) {
    __assert_fail("w * h <= 4096",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/t1.c"
                  ,0x5aa,"OPJ_BOOL opj_t1_allocate_buffers(opj_t1_t *, OPJ_UINT32, OPJ_UINT32)");
  }
  if (t1->encoder == 0) {
    ptr = t1->data;
    if (uVar11 <= t1->datasize) {
      if (ptr != (OPJ_INT32 *)0x0) goto LAB_001282e9;
      goto LAB_001282f7;
    }
    opj_aligned_free(ptr);
    ptr = (OPJ_INT32 *)opj_aligned_malloc((ulong)(uVar11 * 4));
    t1->data = ptr;
    if (ptr != (OPJ_INT32 *)0x0) {
      t1->datasize = uVar11;
LAB_001282e9:
      memset(ptr,0,(ulong)(uVar11 * 4));
      goto LAB_001282f7;
    }
LAB_00128342:
    OVar4 = 0;
  }
  else {
LAB_001282f7:
    uVar11 = w + 2;
    uVar12 = h + 3 >> 2;
    uVar8 = (uVar12 + 2) * uVar11;
    poVar5 = t1->flags;
    if (t1->flagssize < uVar8) {
      opj_aligned_free(poVar5);
      size = (size_t)(uVar8 * 4);
      poVar5 = (opj_flag_t *)opj_aligned_malloc(size);
      t1->flags = poVar5;
      if (poVar5 == (opj_flag_t *)0x0) goto LAB_00128342;
    }
    else {
      size = (size_t)(uVar8 * 4);
    }
    t1->flagssize = uVar8;
    uVar9 = 0;
    memset(poVar5,0,size);
    auVar3 = _DAT_0013c070;
    auVar2 = _DAT_0013c060;
    auVar1 = _DAT_0013c050;
    poVar5 = t1->flags;
    uVar6 = (ulong)(w + 5 & 0x1ffc);
    lVar10 = (ulong)uVar11 - 1;
    auVar13._8_4_ = (int)lVar10;
    auVar13._0_8_ = lVar10;
    auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
    auVar13 = auVar13 ^ _DAT_0013c070;
    do {
      auVar16._8_4_ = (int)uVar9;
      auVar16._0_8_ = uVar9;
      auVar16._12_4_ = (int)(uVar9 >> 0x20);
      auVar19 = (auVar16 | auVar2) ^ auVar3;
      iVar15 = auVar13._4_4_;
      if ((bool)(~(auVar19._4_4_ == iVar15 && auVar13._0_4_ < auVar19._0_4_ ||
                  iVar15 < auVar19._4_4_) & 1)) {
        poVar5[uVar9] = 0x49200000;
      }
      if ((auVar19._12_4_ != auVar13._12_4_ || auVar19._8_4_ <= auVar13._8_4_) &&
          auVar19._12_4_ <= auVar13._12_4_) {
        poVar5[uVar9 + 1] = 0x49200000;
      }
      auVar16 = (auVar16 | auVar1) ^ auVar3;
      iVar20 = auVar16._4_4_;
      if (iVar20 <= iVar15 && (iVar20 != iVar15 || auVar16._0_4_ <= auVar13._0_4_)) {
        poVar5[uVar9 + 2] = 0x49200000;
        poVar5[uVar9 + 3] = 0x49200000;
      }
      uVar9 = uVar9 + 4;
    } while (uVar6 != uVar9);
    uVar8 = (uVar12 + 1) * uVar11;
    lVar10 = (ulong)w + 1;
    auVar19._8_4_ = (int)lVar10;
    auVar19._0_8_ = lVar10;
    auVar19._12_4_ = (int)((ulong)lVar10 >> 0x20);
    uVar9 = 0;
    auVar19 = auVar19 ^ auVar3;
    do {
      auVar17._8_4_ = (int)uVar9;
      auVar17._0_8_ = uVar9;
      auVar17._12_4_ = (int)(uVar9 >> 0x20);
      auVar13 = (auVar17 | auVar2) ^ auVar3;
      iVar15 = auVar19._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar15 && auVar19._0_4_ < auVar13._0_4_ ||
                  iVar15 < auVar13._4_4_) & 1)) {
        poVar5[uVar8 + uVar9] = 0x49200000;
      }
      if ((auVar13._12_4_ != auVar19._12_4_ || auVar13._8_4_ <= auVar19._8_4_) &&
          auVar13._12_4_ <= auVar19._12_4_) {
        poVar5[(ulong)uVar8 + uVar9 + 1] = 0x49200000;
      }
      auVar13 = (auVar17 | auVar1) ^ auVar3;
      iVar20 = auVar13._4_4_;
      if (iVar20 <= iVar15 && (iVar20 != iVar15 || auVar13._0_4_ <= auVar19._0_4_)) {
        poVar5[(ulong)uVar8 + uVar9 + 2] = 0x49200000;
        poVar5[(ulong)uVar8 + uVar9 + 3] = 0x49200000;
      }
      uVar9 = uVar9 + 4;
    } while (uVar6 != uVar9);
    if ((h & 3) != 0) {
      uVar12 = uVar12 * uVar11;
      oVar7 = 0x49000000;
      if ((h & 3) != 1) {
        oVar7 = ((h & 3) == 2 | 8) << 0x1b;
      }
      lVar10 = (ulong)uVar11 - 1;
      auVar14._8_4_ = (int)lVar10;
      auVar14._0_8_ = lVar10;
      auVar14._12_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar9 = 0;
      auVar14 = auVar14 ^ auVar3;
      do {
        auVar18._8_4_ = (int)uVar9;
        auVar18._0_8_ = uVar9;
        auVar18._12_4_ = (int)(uVar9 >> 0x20);
        auVar13 = (auVar18 | auVar2) ^ auVar3;
        iVar15 = auVar14._4_4_;
        if ((bool)(~(auVar13._4_4_ == iVar15 && auVar14._0_4_ < auVar13._0_4_ ||
                    iVar15 < auVar13._4_4_) & 1)) {
          poVar5[uVar12 + uVar9] = oVar7;
        }
        if ((auVar13._12_4_ != auVar14._12_4_ || auVar13._8_4_ <= auVar14._8_4_) &&
            auVar13._12_4_ <= auVar14._12_4_) {
          poVar5[(ulong)uVar12 + uVar9 + 1] = oVar7;
        }
        auVar13 = (auVar18 | auVar1) ^ auVar3;
        iVar20 = auVar13._4_4_;
        if (iVar20 <= iVar15 && (iVar20 != iVar15 || auVar13._0_4_ <= auVar14._0_4_)) {
          poVar5[(ulong)uVar12 + uVar9 + 2] = oVar7;
          poVar5[(ulong)uVar12 + uVar9 + 3] = oVar7;
        }
        uVar9 = uVar9 + 4;
      } while (uVar6 != uVar9);
    }
    t1->w = w;
    t1->h = h;
    OVar4 = 1;
  }
  return OVar4;
}

Assistant:

static OPJ_BOOL opj_t1_allocate_buffers(
    opj_t1_t *t1,
    OPJ_UINT32 w,
    OPJ_UINT32 h)
{
    OPJ_UINT32 flagssize;
    OPJ_UINT32 flags_stride;

    /* No risk of overflow. Prior checks ensure those assert are met */
    /* They are per the specification */
    assert(w <= 1024);
    assert(h <= 1024);
    assert(w * h <= 4096);

    /* encoder uses tile buffer, so no need to allocate */
    if (!t1->encoder) {
        OPJ_UINT32 datasize = w * h;

        if (datasize > t1->datasize) {
            opj_aligned_free(t1->data);
            t1->data = (OPJ_INT32*) opj_aligned_malloc(datasize * sizeof(OPJ_INT32));
            if (!t1->data) {
                /* FIXME event manager error callback */
                return OPJ_FALSE;
            }
            t1->datasize = datasize;
        }
        /* memset first arg is declared to never be null by gcc */
        if (t1->data != NULL) {
            memset(t1->data, 0, datasize * sizeof(OPJ_INT32));
        }
    }

    flags_stride = w + 2U; /* can't be 0U */

    flagssize = (h + 3U) / 4U + 2U;

    flagssize *= flags_stride;
    {
        opj_flag_t* p;
        OPJ_UINT32 x;
        OPJ_UINT32 flags_height = (h + 3U) / 4U;

        if (flagssize > t1->flagssize) {

            opj_aligned_free(t1->flags);
            t1->flags = (opj_flag_t*) opj_aligned_malloc(flagssize * sizeof(
                            opj_flag_t));
            if (!t1->flags) {
                /* FIXME event manager error callback */
                return OPJ_FALSE;
            }
        }
        t1->flagssize = flagssize;

        memset(t1->flags, 0, flagssize * sizeof(opj_flag_t));

        p = &t1->flags[0];
        for (x = 0; x < flags_stride; ++x) {
            /* magic value to hopefully stop any passes being interested in this entry */
            *p++ = (T1_PI_0 | T1_PI_1 | T1_PI_2 | T1_PI_3);
        }

        p = &t1->flags[((flags_height + 1) * flags_stride)];
        for (x = 0; x < flags_stride; ++x) {
            /* magic value to hopefully stop any passes being interested in this entry */
            *p++ = (T1_PI_0 | T1_PI_1 | T1_PI_2 | T1_PI_3);
        }

        if (h % 4) {
            OPJ_UINT32 v = 0;
            p = &t1->flags[((flags_height) * flags_stride)];
            if (h % 4 == 1) {
                v |= T1_PI_1 | T1_PI_2 | T1_PI_3;
            } else if (h % 4 == 2) {
                v |= T1_PI_2 | T1_PI_3;
            } else if (h % 4 == 3) {
                v |= T1_PI_3;
            }
            for (x = 0; x < flags_stride; ++x) {
                *p++ = v;
            }
        }
    }

    t1->w = w;
    t1->h = h;

    return OPJ_TRUE;
}